

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

OpenJTalk * openjtalk_initialize_sub(char *voice,char *dic,char *voiceDir)

{
  _Bool _Var1;
  int iVar2;
  Open_JTalk *str;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  Open_JTalk *open_jtalk;
  OpenJTalk *oj;
  OpenJTalk *in_stack_ffffffffffffffc8;
  OpenJTalk *local_8;
  
  g_psd->length = 0;
  g_psd->sampling_frequency = 0;
  g_psd->data = (short *)0x0;
  g_psd->onFinished = (_func_void *)0x0;
  iVar2 = Pa_Initialize();
  if (iVar2 == 0) {
    local_8 = (OpenJTalk *)malloc(0x680);
    if (local_8 == (OpenJTalk *)0x0) {
      local_8 = (OpenJTalk *)0x0;
    }
    else {
      set_current_path();
      str = Open_JTalk_initialize();
      if (str == (Open_JTalk *)0x0) {
        local_8 = (OpenJTalk *)0x0;
      }
      else {
        local_8->open_jtalk = str;
        clear_path_string((char *)str,(size_t)in_stack_ffffffffffffffc8);
        if (in_RSI != (char *)0x0) {
          strcpy(local_8->dn_dic_path_init,in_RSI);
        }
        clear_path_string((char *)str,(size_t)in_stack_ffffffffffffffc8);
        if (in_RDI != (char *)0x0) {
          strcpy(local_8->fn_voice_path_init,in_RDI);
        }
        clear_path_string((char *)str,(size_t)in_stack_ffffffffffffffc8);
        if (in_RDX != (char *)0x0) {
          strcpy(local_8->dn_voice_dir_path_init,in_RDX);
        }
        _Var1 = JTalkData_initialize(in_stack_ffffffffffffffc8);
        if (!_Var1) {
          local_8 = (OpenJTalk *)0x0;
        }
      }
    }
  }
  else {
    if ((g_verbose & 1U) != 0) {
      console_message((char *)0x199bbc);
    }
    local_8 = (OpenJTalk *)0x0;
  }
  return local_8;
}

Assistant:

OpenJTalk *openjtalk_initialize_sub(const char *voice, const char *dic, const char *voiceDir)
{
	g_psd->length = 0;
	g_psd->sampling_frequency = 0;
	g_psd->data = NULL;
	g_psd->onFinished = NULL;

#ifdef _DEBUG
	g_verbose = true;
#endif

#if (!defined(_WIN32) || defined(__CYGWIN__) || defined(__MINGW32__)) || defined(WINDOWS_PORTAUDIO)
	if (Pa_Initialize() != paNoError)
	{
		if (g_verbose)
		{
			console_message(u8"PortAudioの初期化に失敗しました。\n");
		}
		return NULL;
	}
#endif

	OpenJTalk *oj = (OpenJTalk *)malloc(sizeof(OpenJTalk));
	if (!oj)
	{
		return NULL;
	}

	set_current_path();

	Open_JTalk *open_jtalk = Open_JTalk_initialize();
	if (open_jtalk == NULL)
	{
		return NULL;
	}
	oj->open_jtalk = open_jtalk;

	clear_path_string(oj->dn_dic_path_init, MAX_PATH);
	if (dic != NULL)
	{
		strcpy(oj->dn_dic_path_init, dic);
	}

	clear_path_string(oj->fn_voice_path_init, MAX_PATH);
	if (voice != NULL)
	{
		strcpy(oj->fn_voice_path_init, voice);
	}

	clear_path_string(oj->dn_voice_dir_path_init, MAX_PATH);
	if (voiceDir != NULL)
	{
		strcpy(oj->dn_voice_dir_path_init, voiceDir);
	}

	if (!JTalkData_initialize(oj))
	{
		return NULL;
	}

	return oj;
}